

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O2

shared_ptr<Label> __thiscall
SymbolTable::getLabel(SymbolTable *this,Identifier *symbol,int file,int section)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  int *piVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  undefined4 in_register_00000014;
  string *symbol_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  int in_R8D;
  shared_ptr<Label> sVar8;
  SymbolKey key;
  int local_88;
  int local_84;
  size_type local_80;
  string local_78 [32];
  SymbolKey local_58;
  
  symbol_00 = (string *)CONCAT44(in_register_00000014,file);
  local_88 = in_R8D;
  local_84 = section;
  bVar3 = isValidSymbolName((Identifier *)symbol_00);
  if (bVar3) {
    if (**(char **)symbol_00 == '@') {
      piVar4 = &local_88;
      if ((*(char **)symbol_00)[1] == '@') {
        piVar4 = &local_84;
      }
    }
    else {
      local_88 = -1;
      piVar4 = &local_84;
    }
    *piVar4 = -1;
    iVar2 = local_88;
    SymbolKey::SymbolKey(&local_58,(Identifier *)symbol_00,local_84,local_88);
    iVar5 = std::
            _Rb_tree<SymbolKey,_std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>,_std::_Select1st<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>,_std::less<SymbolKey>,_std::allocator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>_>
            ::find((_Rb_tree<SymbolKey,_std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>,_std::_Select1st<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>,_std::less<SymbolKey>,_std::allocator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>_>
                    *)symbol,&local_58);
    if (iVar5._M_node == (_Base_ptr)&(symbol->_name)._M_string_length) {
      local_80 = symbol[1]._name.field_2._M_allocated_capacity;
      lVar1 = *(long *)((long)&symbol[1]._name.field_2 + 8);
      pmVar6 = std::
               map<SymbolKey,_SymbolTable::SymbolInfo,_std::less<SymbolKey>,_std::allocator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>_>
               ::operator[]((map<SymbolKey,_SymbolTable::SymbolInfo,_std::less<SymbolKey>,_std::allocator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>_>
                             *)symbol,&local_58);
      pmVar6->type = LabelSymbol;
      pmVar6->index = (long)(lVar1 - local_80) >> 4;
      std::__cxx11::string::string(local_78,symbol_00);
      std::make_shared<Label,Identifier>((Identifier *)this);
      std::__cxx11::string::~string(local_78);
      *(uint *)(*(long *)&(this->symbols)._M_t._M_impl + 0x58) = (uint)(iVar2 != in_R8D) + in_R8D;
      std::vector<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_>::push_back
                ((vector<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_> *)
                 &symbol[1]._name.field_2,(value_type *)this);
    }
    else if (*(int *)&iVar5._M_node[2]._M_parent == 0) {
      std::__shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)iVar5._M_node[2]._M_left * 0x10 +
                 symbol[1]._name.field_2._M_allocated_capacity));
    }
    else {
      *(undefined8 *)&(this->symbols)._M_t._M_impl = 0;
      *(undefined8 *)&(this->symbols)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    }
    std::__cxx11::string::~string((string *)&local_58);
    _Var7._M_pi = extraout_RDX_00;
  }
  else {
    *(undefined8 *)&(this->symbols)._M_t._M_impl = 0;
    *(undefined8 *)&(this->symbols)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    _Var7._M_pi = extraout_RDX;
  }
  sVar8.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var7._M_pi;
  sVar8.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Label>)sVar8.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Label> SymbolTable::getLabel(const Identifier& symbol, int file, int section)
{
	if (!isValidSymbolName(symbol))
		return nullptr;

	int actualSection = section;
	setFileSectionValues(symbol,file,section);
	SymbolKey key = { symbol, file, section };

	// find label, create new one if it doesn't exist
	auto it = symbols.find(key);
	if (it == symbols.end())
	{
		SymbolInfo value = { LabelSymbol, labels.size() };
		symbols[key] = value;
		
		std::shared_ptr<Label> result = std::make_shared<Label>(Identifier(symbol));
		if (section == actualSection)
			result->setSection(section);			// local, set section of parent
		else
			result->setSection(actualSection+1);	// global, set section of children
		labels.push_back(result);
		return result;
	}

	// make sure not to match symbols that aren't labels
	if (it->second.type != LabelSymbol)
		return nullptr;

	return labels[it->second.index];
}